

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  xmlParserInputPtr pxVar1;
  commentSAXFunc p_Var2;
  uint val;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  xmlChar *pxVar6;
  char *msg;
  uint val_00;
  int l;
  int rl;
  int ql;
  xmlChar *local_60;
  int local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  int local_34;
  ulong uVar5;
  
  iVar4 = ctxt->input->id;
  if (buf == (xmlChar *)0x0) {
    size = 100;
    buf = (xmlChar *)(*xmlMallocAtomic)(100);
    if (buf == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
    len = 0;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&local_4c);
  local_60 = buf;
  if (val == 0) {
LAB_0015f701:
    msg = "Comment not terminated\n";
LAB_0015f708:
    pxVar6 = (xmlChar *)0x0;
LAB_0015f712:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,msg,pxVar6);
  }
  else {
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_0015f3d3;
    }
    else if (val - 0x10000 < 0x100000 || (val - 0xe000 < 0x1ffe || val < 0xd800)) {
LAB_0015f3d3:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_4c;
      uVar3 = xmlCurrentChar(ctxt,&local_50);
      uVar5 = CONCAT44(extraout_var,uVar3);
      if (uVar3 == 0) goto LAB_0015f701;
      local_48 = uVar5;
      if ((int)uVar3 < 0x100) {
        if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_0015f430:
          pxVar1 = ctxt->input;
          if (*pxVar1->cur == '\n') {
            pxVar1->line = pxVar1->line + 1;
            pxVar1->col = 1;
          }
          else {
            pxVar1->col = pxVar1->col + 1;
          }
          pxVar1->cur = pxVar1->cur + local_50;
          uVar3 = xmlCurrentChar(ctxt,&local_54);
          if (uVar3 != 0) {
            local_40 = 0;
            val_00 = val;
            val = uVar3;
            local_60 = buf;
            local_34 = iVar4;
            do {
              uVar5 = (ulong)val;
              uVar3 = (uint)local_48;
              local_48 = uVar5;
              if ((int)val < 0x100) {
                if ((int)val < 0x20) {
                  if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) {
                    local_60[len] = '\0';
                    if (val != 0) goto LAB_0015f4a6;
                    msg = "Comment not terminated \n<!--%.50s\n";
                    pxVar6 = local_60;
                    goto LAB_0015f712;
                  }
                }
                else if (((val_00 == 0x2d) && (uVar3 == 0x2d)) && (val == 0x3e)) {
                  local_60[len] = '\0';
                  if (local_34 != ctxt->input->id) {
                    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                                   "Comment doesn\'t start and stop in the same entity\n");
                  }
                  xmlNextChar(ctxt);
                  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                      (p_Var2 = ctxt->sax->comment, p_Var2 != (commentSAXFunc)0x0)) &&
                     (ctxt->disableSAX == 0)) {
                    (*p_Var2)(ctxt->userData,local_60);
                  }
                  goto LAB_0015f717;
                }
              }
              else if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) {
                local_60[len] = '\0';
                goto LAB_0015f4a6;
              }
              if (val_00 == 0x2d && uVar3 == 0x2d) {
                xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              if ((10000000 < len) && ((ctxt->options & 0x80000) == 0)) {
                msg = "Comment too big found";
                goto LAB_0015f708;
              }
              pxVar6 = local_60;
              if (size <= len + 5) {
                size = size * 2;
                pxVar6 = (xmlChar *)(*xmlRealloc)(local_60,size);
                if (pxVar6 == (xmlChar *)0x0) {
                  (*xmlFree)(local_60);
                  xmlErrMemory(ctxt,(char *)0x0);
                  return;
                }
              }
              if (local_4c == 1) {
                pxVar6[len] = (xmlChar)val_00;
                len = len + 1;
              }
              else {
                iVar4 = xmlCopyCharMultiByte(pxVar6 + len,val_00);
                len = len + (long)iVar4;
              }
              local_4c = local_50;
              local_50 = local_54;
              local_60 = pxVar6;
              if (local_40 < 0x32) {
                local_40 = local_40 + 1;
              }
              else {
                if ((ctxt->progressive == 0) &&
                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                  xmlGROW(ctxt);
                }
                if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015f717;
                local_40 = 0;
              }
              pxVar1 = ctxt->input;
              if (*pxVar1->cur == '\n') {
                pxVar1->line = pxVar1->line + 1;
                pxVar1->col = 1;
              }
              else {
                pxVar1->col = pxVar1->col + 1;
              }
              pxVar1->cur = pxVar1->cur + local_54;
              val = xmlCurrentChar(ctxt,&local_54);
              val_00 = uVar3;
              if (val == 0) {
                if (ctxt->progressive == 0) {
                  pxVar1 = ctxt->input;
                  if (((((long)pxVar1->cur - (long)pxVar1->base < 0x1f5) ||
                       (499 < (long)pxVar1->end - (long)pxVar1->cur)) ||
                      (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
                     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                    xmlGROW(ctxt);
                  }
                }
                val = xmlCurrentChar(ctxt,&local_54);
              }
            } while( true );
          }
          goto LAB_0015f701;
        }
      }
      else if (uVar3 - 0x10000 < 0x100000 || (uVar3 - 0xe000 < 0x1ffe || uVar3 < 0xd800))
      goto LAB_0015f430;
    }
LAB_0015f4a6:
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",val);
  }
LAB_0015f717:
  (*xmlFree)(local_60);
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    size_t count = 0;
    int inputid;

    DEBUG_ENTER(("xmlParseCommentComplex(%s, %s, %ld, %ld);\n", dbgCtxt(ctxt), dbgStr(buf), (long)len, (long)size));

    inputid = ctxt->input->id;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    RETURN();
	}
    }
    GROW;	/* Assure there's enough input data */
    q = CUR_CHAR(ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	RETURN();
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	RETURN();
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
        if ((len > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            RETURN();
        }
	if (len + 5 >= size) {
	    xmlChar *new_buf;
            size_t new_size;

	    new_size = size * 2;
	    new_buf = (xmlChar *) xmlRealloc(buf, new_size);
	    if (new_buf == NULL) {
		xmlFree (buf);
		xmlErrMemory(ctxt, NULL);
		RETURN();
	    }
	    buf = new_buf;
            size = new_size;
	}
	COPY_BUF(ql,buf,len,q);
	q = r;
	ql = rl;
	r = cur;
	rl = l;

	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		RETURN();
            }
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    SHRINK;
	    GROW;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
	if (inputid != ctxt->input->id) {
	    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
		           "Comment doesn't start and stop in the same"
                           " entity\n");
	}
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseComment. ctxt = %s;\n", dbgCtxt(ctxt)));
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseComment. ctxt = %s;\n", dbgCtxt(ctxt)));
}